

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> __thiscall
duckdb::StringUtil::ParseJSONMap(StringUtil *this,string *json,bool ignore_errors)

{
  yyjson_val *pyVar1;
  ulong uVar2;
  ulong uVar3;
  _func_void_void_ptr_void_ptr *p_Var4;
  void *pvVar5;
  yyjson_doc *pyVar6;
  char *pcVar7;
  pointer pCVar8;
  SerializationException *pSVar9;
  uint uVar10;
  char *pcVar11;
  yyjson_val *pyVar12;
  ulong uVar13;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> nested_result;
  string local_110;
  yyjson_doc *local_f0;
  _Head_base<0UL,_duckdb::ComplexJSON_*,_false> local_e8;
  uint local_dc;
  string *local_d8;
  yyjson_val *local_d0;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> local_c8;
  size_t json_str_len;
  undefined1 local_b0 [16];
  ulong local_a0;
  duckdb local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  make_uniq<duckdb::ComplexJSON,std::__cxx11::string_const&>((duckdb *)this,json);
  if (json->_M_string_length != 0) {
    local_e8._M_head_impl = (ComplexJSON *)this;
    pyVar6 = duckdb_yyjson::yyjson_read_opts
                       ((json->_M_dataplus)._M_p,json->_M_string_length,0x40,(yyjson_alc *)0x0,
                        (yyjson_read_err *)0x0);
    if (pyVar6 == (yyjson_doc *)0x0) {
      if (!ignore_errors) {
        pSVar9 = (SerializationException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_110,"Failed to parse JSON string: %s",(allocator *)&json_str_len
                  );
        ::std::__cxx11::string::string((string *)&local_50,(string *)json);
        SerializationException::SerializationException<std::__cxx11::string>
                  (pSVar9,&local_110,&local_50);
        __cxa_throw(pSVar9,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_dc = (uint)ignore_errors;
      pyVar1 = pyVar6->root;
      local_f0 = pyVar6;
      local_d8 = json;
      if ((pyVar1 == (yyjson_val *)0x0) || ((~(uint)pyVar1->tag & 7) != 0)) {
        p_Var4 = (pyVar6->alc).free;
        pvVar5 = (pyVar6->alc).ctx;
        (pyVar6->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (pyVar6->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (pyVar6->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (pyVar6->alc).ctx = (void *)0x0;
        if (pyVar6->str_pool != (char *)0x0) {
          (*p_Var4)(pvVar5,pyVar6->str_pool);
        }
        (*p_Var4)(pvVar5,pyVar6);
        if (!ignore_errors) {
          pSVar9 = (SerializationException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_110,"Failed to parse JSON string: %s",
                     (allocator *)&json_str_len);
          ::std::__cxx11::string::string((string *)&local_70,(string *)local_d8);
          SerializationException::SerializationException<std::__cxx11::string>
                    (pSVar9,&local_110,&local_70);
          __cxa_throw(pSVar9,&SerializationException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
      }
      else {
        pyVar12 = pyVar1 + 1;
        uVar13 = pyVar1->tag >> 8;
        while( true ) {
          pyVar6 = local_f0;
          if (uVar13 == 0) break;
          uVar2 = pyVar12[1].tag;
          pcVar11 = pyVar12[1].uni.str;
          uVar10 = (uint)uVar2;
          pcVar7 = pcVar11;
          if ((~uVar10 & 6) != 0) {
            pcVar7 = (char *)0x10;
          }
          local_d0 = (yyjson_val *)(pcVar7 + (long)&pyVar12[1].tag);
          if ((~(byte)uVar2 & 7) == 0) {
            uVar2 = pyVar12->tag;
            if (((uint)uVar2 & 7) == 5) {
              pcVar11 = (pyVar12->uni).str;
            }
            else {
              pcVar11 = (char *)0x0;
            }
            pcVar7 = duckdb_yyjson::yyjson_val_write_opts
                               (pyVar12 + 1,0,(yyjson_alc *)0x0,&json_str_len,
                                (yyjson_write_err *)0x0);
            pyVar6 = local_f0;
            if (pcVar7 == (char *)0x0) {
              p_Var4 = (local_f0->alc).free;
              pvVar5 = (local_f0->alc).ctx;
              (local_f0->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
              (local_f0->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
              (local_f0->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
              (local_f0->alc).ctx = (void *)0x0;
              if (local_f0->str_pool != (char *)0x0) {
                (*p_Var4)(pvVar5,local_f0->str_pool);
              }
              (*p_Var4)(pvVar5,pyVar6);
              if (ignore_errors) {
                return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
                       (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                        )this;
              }
              pSVar9 = (SerializationException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_110,"Failed to stringify nested JSON object",
                         (allocator *)&nested_result);
              SerializationException::SerializationException(pSVar9,&local_110);
              __cxa_throw(pSVar9,&SerializationException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,pcVar7,pcVar7 + json_str_len);
            local_a0 = uVar13 - 1;
            ParseJSONMap((StringUtil *)&nested_result,&local_110,SUB41(local_dc,0));
            ::std::__cxx11::string::~string((string *)&local_110);
            pCVar8 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                     ::operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                                   *)this);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,pcVar11,pcVar11 + (uVar2 >> 8));
            local_c8._M_t.
            super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
            .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
                 (__uniq_ptr_data<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true,_true>
                  )(__uniq_ptr_data<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true,_true>
                    )nested_result.
                     super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                     .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
            nested_result.
            super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
            super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
            .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
                 (__uniq_ptr_data<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true,_true>
                  )0x0;
            ComplexJSON::AddObject
                      (pCVar8,&local_110,
                       (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                        *)&local_c8);
            std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
            ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                         *)&local_c8);
            ::std::__cxx11::string::~string((string *)&local_110);
            free(pcVar7);
            std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
            ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                         *)&nested_result);
            pyVar12 = local_d0;
            uVar13 = local_a0;
          }
          else {
            if ((uVar10 & 7) != 5) {
              p_Var4 = (local_f0->alc).free;
              pvVar5 = (local_f0->alc).ctx;
              (local_f0->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
              (local_f0->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
              (local_f0->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
              (local_f0->alc).ctx = (void *)0x0;
              if (local_f0->str_pool != (char *)0x0) {
                (*p_Var4)(pvVar5,local_f0->str_pool);
              }
              (*p_Var4)(pvVar5,pyVar6);
              if (ignore_errors) {
                return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
                       (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                        )this;
              }
              pSVar9 = (SerializationException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_110,"Failed to parse JSON string: %s",
                         (allocator *)&json_str_len);
              ::std::__cxx11::string::string((string *)&local_90,(string *)local_d8);
              SerializationException::SerializationException<std::__cxx11::string>
                        (pSVar9,&local_110,&local_90);
              __cxa_throw(pSVar9,&SerializationException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            uVar3 = pyVar12->tag;
            if (((uint)uVar3 & 7) == 5) {
              pcVar7 = (pyVar12->uni).str;
            }
            else {
              pcVar7 = (char *)0x0;
            }
            if ((uVar10 & 7) != 5) {
              pcVar11 = (char *)0x0;
            }
            pCVar8 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                     ::operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                                   *)local_e8._M_head_impl);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,pcVar7,pcVar7 + (uVar3 >> 8));
            this = (StringUtil *)local_e8._M_head_impl;
            json_str_len = (size_t)local_b0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&json_str_len,pcVar11,pcVar11 + (uVar2 >> 8));
            make_uniq<duckdb::ComplexJSON,std::__cxx11::string>
                      (local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&json_str_len);
            ComplexJSON::AddObject
                      (pCVar8,&local_110,
                       (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                        *)local_98);
            std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
            ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                         *)local_98);
            ::std::__cxx11::string::~string((string *)&json_str_len);
            ::std::__cxx11::string::~string((string *)&local_110);
            pyVar12 = local_d0;
            uVar13 = uVar13 - 1;
          }
        }
        p_Var4 = (local_f0->alc).free;
        pvVar5 = (local_f0->alc).ctx;
        (local_f0->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (local_f0->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (local_f0->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (local_f0->alc).ctx = (void *)0x0;
        if (local_f0->str_pool != (char *)0x0) {
          (*p_Var4)(pvVar5,local_f0->str_pool);
        }
        (*p_Var4)(pvVar5,pyVar6);
      }
    }
  }
  return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
         (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)this;
}

Assistant:

unique_ptr<ComplexJSON> StringUtil::ParseJSONMap(const string &json, bool ignore_errors) {
	auto result = make_uniq<ComplexJSON>(json);
	if (json.empty()) {
		return result;
	}
	yyjson_read_flag flags = YYJSON_READ_ALLOW_INVALID_UNICODE;
	yyjson_doc *doc = yyjson_read(json.c_str(), json.size(), flags);
	if (!doc) {
		if (ignore_errors) {
			return result;
		}
		throw SerializationException("Failed to parse JSON string: %s", json);
	}
	yyjson_val *root = yyjson_doc_get_root(doc);
	if (!root || yyjson_get_type(root) != YYJSON_TYPE_OBJ) {
		yyjson_doc_free(doc);
		if (ignore_errors) {
			return result;
		}
		throw SerializationException("Failed to parse JSON string: %s", json);
	}
	yyjson_obj_iter iter;
	yyjson_obj_iter_init(root, &iter);
	yyjson_val *key, *value;
	while ((key = yyjson_obj_iter_next(&iter))) {
		value = yyjson_obj_iter_get_val(key);
		auto type = yyjson_get_type(value);
		if (type == YYJSON_TYPE_STR) {
			// Since this is a string, we can directly add the value
			const auto key_val = yyjson_get_str(key);
			const auto key_len = yyjson_get_len(key);
			const auto value_val = yyjson_get_str(value);
			const auto value_len = yyjson_get_len(value);
			result->AddObject(string(key_val, key_len), make_uniq<ComplexJSON>(string(value_val, value_len)));
		} else if (type == YYJSON_TYPE_OBJ) {
			// We recurse, this is a complex json
			const auto key_val = yyjson_get_str(key);
			const auto key_len = yyjson_get_len(key);
			// Convert the object value to a JSON string and recurse
			size_t json_str_len;
			char *json_str = yyjson_val_write(value, 0, &json_str_len);
			if (json_str) {
				auto nested_result = ParseJSONMap(string(json_str, json_str_len), ignore_errors);
				result->AddObject(string(key_val, key_len), std::move(nested_result));
				free(json_str); // Clean up the allocated string
			} else {
				yyjson_doc_free(doc);
				if (ignore_errors) {
					return result;
				}
				throw SerializationException("Failed to stringify nested JSON object");
			}
		} else {
			// Anything else is invalid.
			yyjson_doc_free(doc);
			if (ignore_errors) {
				return result;
			}
			throw SerializationException("Failed to parse JSON string: %s", json);
		}
	}
	yyjson_doc_free(doc);
	return result;
}